

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O0

double psnr(jas_matrix_t *x,jas_matrix_t *y,int depth)

{
  double dVar1;
  undefined8 local_40;
  double p;
  double rmse;
  double mse;
  int depth_local;
  jas_matrix_t *y_local;
  jas_matrix_t *x_local;
  
  dVar1 = msen(x,y,2);
  dVar1 = sqrt(dVar1);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    local_40 = log10((double)((1 << ((byte)depth & 0x1f)) + -1) / dVar1);
    local_40 = local_40 * 20.0;
  }
  else {
    local_40 = INFINITY;
  }
  return local_40;
}

Assistant:

double psnr(jas_matrix_t *x, jas_matrix_t *y, int depth)
{
	double mse;
	double rmse;
	double p;
	mse = msen(x, y, 2);
	rmse = sqrt(mse);
	p = ((1 << depth) - 1);
	return (rmse != 0) ? (20.0 * log10(p / rmse)) : INFINITY;
}